

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq2psf.cpp
# Opt level: O2

bool build_choroq_psf(char *psf_path,uint8_t *tsq,size_t tsq_size,uint8_t *tvb,size_t tvb_size,
                     bool write_driver,char *driver_psflib_path,bool write_param,int song_index,
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     tags)

{
  uint8_t *__s1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tags_00;
  bool bVar1;
  int iVar2;
  void *__s;
  PSFFile *pPVar3;
  ssize_t sVar4;
  char *pcVar5;
  uint uVar6;
  undefined7 in_register_00000089;
  uint load_address;
  undefined4 uVar7;
  uint uVar8;
  undefined1 in_stack_fffffffffffff748 [12];
  uint32_t initial_pc;
  uint32_t uVar9;
  void *pvVar10;
  char *region_name;
  uint32_t initial_sp;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_868;
  uint8_t psx_exe_header [2048];
  
  pcVar5 = (char *)tvb;
  __s = operator_new__(0x200000);
  memset(__s,0,0x200000);
  std::__cxx11::string::string
            ((string *)psx_exe_header,driver_psflib_path,(allocator *)&stack0xfffffffffffff753);
  pPVar3 = PSFFile::load((string *)psx_exe_header);
  std::__cxx11::string::~string((string *)psx_exe_header);
  if (pPVar3 == (PSFFile *)0x0) {
    bVar1 = false;
    fprintf(_stderr,"Error: Unable to read \"%s\"\n",driver_psflib_path);
    goto LAB_00105afc;
  }
  if (pPVar3->version != '\x01') {
    bVar1 = false;
    fprintf(_stderr,"Error: Invalid PSF version \"%s\"\n",driver_psflib_path);
    (*pPVar3->_vptr_PSFFile[1])(pPVar3);
    goto LAB_00105afc;
  }
  uVar7 = (undefined4)CONCAT71(in_register_00000089,write_driver);
  sVar4 = ZlibReader::read(&pPVar3->compressed_exe,(int)psx_exe_header,(void *)0x800,(size_t)pcVar5)
  ;
  if ((int)sVar4 == 0x800) {
    if (psx_exe_header._0_8_ == 0x45584520582d5350) {
      if ((psx_exe_header._24_4_ & 0xffffff) + psx_exe_header._28_4_ < 0x200000) {
        __s1 = psx_exe_header + 0x4c;
        iVar2 = bcmp(__s1,"Sony Computer Entertainment Inc. for Japan area",0x30);
        if (iVar2 == 0) {
          region_name = "Japan";
          initial_pc = psx_exe_header._16_4_;
          initial_sp = psx_exe_header._48_4_;
        }
        else {
          iVar2 = bcmp(__s1,"Sony Computer Entertainment Inc. for North America area",0x38);
          pcVar5 = "North America";
          region_name = "North America";
          initial_pc = psx_exe_header._16_4_;
          initial_sp = psx_exe_header._48_4_;
          if (iVar2 != 0) {
            iVar2 = bcmp(__s1,"Sony Computer Entertainment Inc. for Europe area",0x31);
            if (iVar2 == 0) {
              region_name = "Europe";
              initial_pc = psx_exe_header._16_4_;
              initial_sp = psx_exe_header._48_4_;
            }
            else {
              fprintf(_stderr,"Warning: Unknown region name \"%s\"\n",driver_psflib_path);
              initial_pc = psx_exe_header._16_4_;
              initial_sp = psx_exe_header._48_4_;
            }
          }
        }
        pvVar10 = __s;
        if ((char)uVar7 == '\0') {
          load_address = 0x80200000;
          uVar8 = 0x80000000;
        }
        else {
          sVar4 = ZlibReader::read(&pPVar3->compressed_exe,
                                   (psx_exe_header._24_4_ & 0xffffff) + (int)__s,
                                   (void *)(ulong)(uint)psx_exe_header._28_4_,(size_t)pcVar5);
          if ((int)sVar4 != psx_exe_header._28_4_) {
            pcVar5 = "Error: Unable to read driver block \"%s\"\n";
            goto LAB_00105b96;
          }
          load_address = 0x80200000;
          if ((uint)psx_exe_header._24_4_ < 0x80200000) {
            load_address = psx_exe_header._24_4_;
          }
          uVar8 = 0x80000000;
          if (0x80000000 < (uint)(psx_exe_header._28_4_ + psx_exe_header._24_4_)) {
            uVar8 = psx_exe_header._28_4_ + psx_exe_header._24_4_;
          }
        }
        (*pPVar3->_vptr_PSFFile[1])(pPVar3);
        uVar6 = uVar8;
        if (tsq_size != 0 && tsq != (uint8_t *)0x0) {
          memcpy((void *)((long)__s + 0xf0000),tsq,tsq_size);
          if (0x800effff < load_address) {
            load_address = 0x800f0000;
          }
          uVar6 = (int)tsq_size + 0x800f0000;
          if (uVar6 < uVar8) {
            uVar6 = uVar8;
          }
        }
        uVar8 = uVar6;
        uVar9 = initial_pc;
        if (tvb_size != 0 && tvb != (uint8_t *)0x0) {
          memcpy((void *)((long)__s + 0x1d800),tvb,tvb_size);
          if (0x8001d7ff < load_address) {
            load_address = 0x8001d800;
          }
          uVar8 = (int)tvb_size + 0x8001d800;
          if (uVar8 < uVar6) {
            uVar8 = uVar6;
          }
        }
        uVar6 = uVar8;
        if (write_param) {
          *(char *)((long)__s + 0xef800) = (char)song_index;
          if (0x800ef7ff < load_address) {
            load_address = 0x800ef800;
          }
          uVar6 = 0x800ef808;
          if (0x800ef808 < uVar8) {
            uVar6 = uVar8;
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_Rb_tree(&local_868,
                   (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)tags._M_t._M_impl._0_8_);
        tags_00._M_t._M_impl.super__Rb_tree_header._M_header._0_12_ = in_stack_fffffffffffff748;
        tags_00._M_t._M_impl._0_8_ = &local_868;
        tags_00._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = uVar9;
        tags_00._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pvVar10;
        tags_00._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)region_name;
        tags_00._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = initial_sp;
        tags_00._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = uVar7;
        bVar1 = save_psf1(psf_path,(uint8_t *)((long)__s + (ulong)(load_address & 0xffffff)),
                          load_address,(ulong)(uVar6 - load_address),initial_pc,initial_sp,
                          region_name,tags_00);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_868);
        goto LAB_00105afc;
      }
    }
    pcVar5 = "Error: Invalid PS-X EXE header \"%s\"\n";
  }
  else {
    pcVar5 = "Error: Unable to read PS-X EXE header \"%s\"\n";
  }
LAB_00105b96:
  bVar1 = false;
  fprintf(_stderr,pcVar5,driver_psflib_path);
  (*pPVar3->_vptr_PSFFile[1])(pPVar3);
LAB_00105afc:
  operator_delete__(__s);
  return bVar1;
}

Assistant:

bool build_choroq_psf(const char * psf_path, const uint8_t * tsq, size_t tsq_size, const uint8_t * tvb, size_t tvb_size, bool write_driver, const char * driver_psflib_path, bool write_param, int song_index, std::map<std::string, std::string> tags)
{
	uint8_t * mem = new uint8_t[PSX_MEMORY_SIZE];
	if (mem == NULL) {
		fprintf(stderr, "Error: Memory allocation error\n");
		return false;
	}
	memset(mem, 0, PSX_MEMORY_SIZE);

	uint32_t load_address = 0x80000000 | PSX_MEMORY_SIZE;
	uint32_t load_end_address = 0x80000000 | 0;

	PSFFile * driver_psflib = PSFFile::load(driver_psflib_path);
	if (driver_psflib == NULL) {
		fprintf(stderr, "Error: Unable to read \"%s\"\n", driver_psflib_path);
		delete[] mem;
		return false;
	}

	if (driver_psflib->version != PSF1_PSF_VERSION) {
		fprintf(stderr, "Error: Invalid PSF version \"%s\"\n", driver_psflib_path);
		delete driver_psflib;
		delete[] mem;
		return false;
	}

	uint8_t psx_exe_header[PSF1_EXE_HEADER_SIZE];
	if (driver_psflib->compressed_exe.read(psx_exe_header, PSF1_EXE_HEADER_SIZE) != PSF1_EXE_HEADER_SIZE) {
		fprintf(stderr, "Error: Unable to read PS-X EXE header \"%s\"\n", driver_psflib_path);
		delete driver_psflib;
		delete[] mem;
		return false;
	}

	uint32_t driver_load_address = readInt(&psx_exe_header[0x18]);
	uint32_t driver_load_size = readInt(&psx_exe_header[0x1c]);
	uint32_t initial_pc = readInt(&psx_exe_header[0x10]);
	uint32_t initial_sp = readInt(&psx_exe_header[0x30]);

	if (memcmp(psx_exe_header, "PS-X EXE", 8) != 0 || (driver_load_address & PSX_MEMORY_MASK) + driver_load_size >= PSX_MEMORY_SIZE) {
		fprintf(stderr, "Error: Invalid PS-X EXE header \"%s\"\n", driver_psflib_path);
		delete driver_psflib;
		delete[] mem;
		return false;
	}

	const char * region_name;
	if (strcmp((const char *)&psx_exe_header[0x4c], "Sony Computer Entertainment Inc. for Japan area") == 0) {
		region_name = "Japan";
	}
	else if (strcmp((const char *)&psx_exe_header[0x4c], "Sony Computer Entertainment Inc. for North America area") == 0) {
		region_name = "North America";
	}
	else if (strcmp((const char *)&psx_exe_header[0x4c], "Sony Computer Entertainment Inc. for Europe area") == 0) {
		region_name = "Europe";
	}
	else {
		fprintf(stderr, "Warning: Unknown region name \"%s\"\n", driver_psflib_path);
		region_name = "North America";
	}

	if (write_driver) {
		if (driver_psflib->compressed_exe.read(&mem[driver_load_address & PSX_MEMORY_MASK], driver_load_size) != driver_load_size) {
			fprintf(stderr, "Error: Unable to read driver block \"%s\"\n", driver_psflib_path);
			delete driver_psflib;
			delete[] mem;
			return false;
		}

		load_address = std::min<uint32_t>(load_address, driver_load_address);
		load_end_address = std::max<uint32_t>(load_end_address, driver_load_address + driver_load_size);
	}
	delete driver_psflib;

	if (tsq != NULL && tsq_size != 0) {
		memcpy(&mem[MY_SEQ & PSX_MEMORY_MASK], tsq, tsq_size);
		load_address = std::min<uint32_t>(load_address, MY_SEQ);
		load_end_address = std::max<uint32_t>(load_end_address, MY_SEQ + tsq_size);
	}

	if (tvb != NULL && tvb_size != 0) {
		memcpy(&mem[MY_INSTR & PSX_MEMORY_MASK], tvb, tvb_size);
		load_address = std::min<uint32_t>(load_address, MY_INSTR);
		load_end_address = std::max<uint32_t>(load_end_address, MY_INSTR + tvb_size);
	}

	if (write_param) {
		writeByte(&mem[MPARAM_SONGINDEX & PSX_MEMORY_MASK], song_index);
		load_address = std::min<uint32_t>(load_address, MINIPSF_PARAM);
		load_end_address = std::max<uint32_t>(load_end_address, MINIPSF_PARAM + 8);
	}

	uint32_t rom_size = load_end_address - load_address;

	if (!save_psf1(psf_path, &mem[load_address & PSX_MEMORY_MASK], load_address, rom_size, initial_pc, initial_sp, region_name, tags)) {
		delete[] mem;
		return false;
	}

	delete[] mem;
	return true;
}